

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::initActiveControl(PeleLM *this)

{
  double *pdVar1;
  double *pdVar2;
  ostringstream *poVar3;
  uint uVar4;
  double *pdVar5;
  Real *pRVar6;
  double dVar7;
  Real RVar8;
  long lVar9;
  undefined4 uVar10;
  ACParm *pAVar11;
  ACParm *pAVar12;
  DataContainer *pDVar13;
  pointer pdVar14;
  int i_2;
  int dim;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int k;
  int iVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  DeviceVector<amrex::Real> s_ext_v;
  ParmParse ppAC;
  GpuArray<double,_13U> pmf_vals;
  Real s_ext [16];
  double local_388 [4];
  undefined1 local_368 [16];
  double local_358;
  double dStack_350;
  undefined1 *local_348;
  double local_340;
  double local_338;
  ProbParm *local_330;
  Real local_328 [4];
  PODVector<double,_std::allocator<double>_> local_308;
  ParmParse local_2f0;
  undefined1 local_298 [24];
  double adStack_280 [47];
  double local_108 [10];
  double local_b8 [3];
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined5 uStack_98;
  undefined3 uStack_93;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    if (1 < NavierStokesBase::verbose) {
      local_298._8_8_ = amrex::OutStream();
      local_298._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_298._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_298 + 0x10));
      *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
           *(undefined8 *)
            ((long)(local_298._8_8_ + 8) +
            *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 0x10),"PeleLM::initActiveControl()\n",0x1c);
      amrex::Print::~Print((Print *)local_298);
    }
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"active_control","");
    amrex::ParmParse::ParmParse(&local_2f0,(string *)local_298);
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    amrex::ParmParse::query(&local_2f0,"on",&ctrl_active,0);
    amrex::ParmParse::query(&local_2f0,"use_temp",&ctrl_use_temp,0);
    amrex::ParmParse::query(&local_2f0,"temperature",&ctrl_temperature,0);
    amrex::ParmParse::query(&local_2f0,"tau",&ctrl_tauControl,0);
    amrex::ParmParse::query(&local_2f0,"v",&ctrl_verbose,0);
    amrex::ParmParse::query(&local_2f0,"height",&ctrl_h,0);
    amrex::ParmParse::query(&local_2f0,"changeMax",&ctrl_changeMax,0);
    amrex::ParmParse::query(&local_2f0,"velMax",&ctrl_velMax,0);
    amrex::ParmParse::query(&local_2f0,"pseudo_gravity",&ctrl_pseudoGravity,0);
    amrex::ParmParse::query(&local_2f0,"flame_direction",&ctrl_flameDir,0);
    amrex::ParmParse::query(&local_2f0,"AC_history",&ctrl_AChistory_abi_cxx11_,0);
    amrex::ParmParse::query(&local_2f0,"npoints_average",&ctrl_NavgPts,0);
    amrex::ParmParse::query(&local_2f0,"method",&ctrl_method,0);
    if ((ctrl_use_temp == true) && (ctrl_temperature <= 0.0)) {
      amrex::Error_host("active_control.temperature MUST be set with active_control.use_temp = 1");
    }
    if ((ctrl_active == true) && (ctrl_tauControl <= 0.0)) {
      amrex::Error_host("active_control.tau MUST be set when using active_control");
    }
    if ((ctrl_active == true) && (ctrl_h <= 0.0)) {
      amrex::Error_host("active_control.height MUST be set when using active_control");
    }
    if ((ctrl_active == true) && (2 < ctrl_flameDir)) {
      amrex::Error_host("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");
    }
    pAVar11 = ac_parm;
    if (ctrl_active == false) {
      ac_parm->ctrl_active = 0;
      pAVar12 = ac_parm_d;
      uVar4 = pAVar11->ctrl_active;
      uVar10 = *(undefined4 *)&pAVar11->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar11->ctrl_tBase;
      pAVar12->ctrl_active = uVar4;
      *(undefined4 *)&pAVar12->field_0x1c = uVar10;
      RVar8 = pAVar11->ctrl_V_in;
      pAVar12->ctrl_dV = pAVar11->ctrl_dV;
      pAVar12->ctrl_V_in = RVar8;
    }
    else {
      ac_parm->ctrl_active = 1;
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_time_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_velo_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      local_298._0_8_ = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_cntl_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,(value_type_conflict2 *)local_298);
      pDVar13 = pmf_data.m_data_d;
      local_330 = prob_parm_d;
      local_340 = 1.0;
      uVar17 = 0;
      do {
        if ((uint)ctrl_flameDir != uVar17) {
          local_340 = local_340 *
                      ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[uVar17] -
                      (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[uVar17]);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 3);
      local_308.m_capacity = 0;
      local_308.m_data = (double *)0x0;
      local_308.m_size = 0;
      amrex::PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_308,0x12);
      pdVar14 = local_308.m_data;
      local_308.m_size = 0x10;
      local_328[0] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[0];
      local_328[1] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
      local_328[2] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[2];
      local_328[ctrl_flameDir] = local_328[ctrl_flameDir] + -1.0;
      RVar8 = local_328[1];
      dVar7 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[1] -
              (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
      pdVar14[2] = 0.0;
      *pdVar14 = 0.0;
      pdVar14[1] = 0.0;
      local_338 = local_330->MeanFlow * 0.1 * 2.061830580524281e-12 * 0.18617949512112375;
      dVar29 = sin((local_328[1] * 25.132741228718345) / dVar7);
      dVar32 = sin(((RVar8 + -0.004598) * 12.566370614359172) / dVar7);
      dVar30 = sin(((RVar8 + -0.00712435) * 18.84955592153876) / dVar7);
      dVar31 = sin(((RVar8 + -0.0033) * 31.41592653589793) / dVar7);
      dVar7 = sin(((RVar8 + -0.014234) * 0.0031415926535897933) / dVar7);
      dVar7 = (dVar7 * 1.0982 + dVar31 * 0.917 + dVar30 * 0.945 + dVar32 * 1.023 + dVar29) *
              local_338;
      iVar27 = local_330->FlowDir;
      if (iVar27 == 0) {
        *pdVar14 = local_330->MeanFlow;
        pdVar14[1] = dVar7;
      }
      else if (iVar27 == 1) {
        pdVar14[1] = local_330->MeanFlow;
        *pdVar14 = dVar7;
      }
      else if (iVar27 == 2) {
        pdVar14[2] = local_330->MeanFlow;
      }
      adStack_280[7] = 0.0;
      adStack_280[8] = 0.0;
      adStack_280[5] = 0.0;
      adStack_280[6] = 0.0;
      adStack_280[3] = 0.0;
      adStack_280[4] = 0.0;
      adStack_280[1] = 0.0;
      adStack_280[2] = 0.0;
      local_298._16_8_ = 0;
      adStack_280[0] = 0.0;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      adStack_280[9] = 0.0;
      pdVar5 = pDVar13->pmf_X;
      uVar4 = pDVar13->m_nPoint;
      uVar28 = (ulong)(uVar4 - 1);
      uVar17 = (ulong)-(uint)(*pdVar5 <= -1.0);
      if (pdVar5[uVar28] <= -1.0 && pdVar5[uVar28] != -1.0) {
        uVar17 = uVar28;
      }
      uVar15 = (uint)uVar17;
      if (pDVar13->m_doAverage == 0) {
        if (uVar15 == 0xffffffff) {
          uVar22 = 0xffffffff;
          uVar15 = 0xffffffff;
          if (uVar28 != 0) {
            uVar21 = 0;
            do {
              if ((pdVar5[uVar21] <= -1.0) && (-1.0 <= pdVar5[uVar21 + 1])) {
                uVar17 = (ulong)((int)uVar21 + 1);
                uVar22 = uVar21 & 0xffffffff;
              }
              uVar15 = (uint)uVar22;
              uVar21 = uVar21 + 1;
            } while (uVar28 != uVar21);
          }
        }
        uVar20 = pDVar13->m_nVar;
        if (uVar20 != 0) {
          dVar7 = pdVar5[(int)uVar15];
          pRVar6 = pDVar13->pmf_Y;
          uVar16 = (uint)uVar17;
          uVar24 = 0;
          uVar25 = uVar15;
          do {
            dVar29 = pRVar6[uVar25];
            dVar32 = 0.0;
            if (uVar15 != uVar16) {
              dVar32 = (pRVar6[uVar17] - dVar29) / (pdVar5[(int)uVar16] - dVar7);
            }
            *(double *)(local_298 + (long)(int)uVar24 * 8) = dVar32 * (-1.0 - dVar7) + dVar29;
            uVar24 = uVar24 + 1;
            uVar17 = (ulong)((int)uVar17 + uVar4);
            uVar25 = uVar25 + uVar4;
          } while (uVar20 != uVar24);
        }
      }
      else {
        uVar22 = uVar17;
        uVar20 = uVar15;
        if (uVar15 == 0xffffffff) {
          uVar21 = 0xffffffff;
          uVar20 = 0xffffffff;
          if (uVar28 != 0) {
            uVar23 = 0;
            do {
              if ((pdVar5[uVar23] <= -1.0) && (-1.0 <= pdVar5[uVar23 + 1])) {
                uVar22 = (ulong)((int)uVar23 + 1);
                uVar21 = uVar23 & 0xffffffff;
              }
              uVar20 = (uint)uVar21;
              uVar23 = uVar23 + 1;
            } while (uVar28 != uVar23);
          }
        }
        uVar25 = uVar15;
        if (uVar15 == 0xffffffff) {
          uVar21 = 0xffffffff;
          uVar25 = 0xffffffff;
          if (uVar28 != 0) {
            uVar23 = 0;
            do {
              if ((pdVar5[uVar23] <= -1.0) && (-1.0 <= pdVar5[uVar23 + 1])) {
                uVar17 = (ulong)((int)uVar23 + 1);
                uVar21 = uVar23 & 0xffffffff;
              }
              uVar15 = (uint)uVar17;
              uVar23 = uVar23 + 1;
              uVar25 = (uint)uVar21;
            } while (uVar28 != uVar23);
          }
        }
        uVar16 = pDVar13->m_nVar;
        if (uVar16 != 0) {
          dVar7 = pdVar5[(int)uVar20];
          pRVar6 = pDVar13->pmf_Y;
          uVar24 = (uint)uVar22;
          dVar29 = pdVar5[(int)uVar24];
          uVar26 = 0;
          do {
            iVar27 = uVar26 * uVar4;
            dVar32 = 0.0;
            if (uVar20 != uVar24) {
              dVar32 = (pRVar6[iVar27 + uVar24] - pRVar6[iVar27 + uVar20]) / (dVar29 - dVar7);
            }
            dVar32 = dVar32 * (-1.0 - dVar7) + pRVar6[iVar27 + uVar20];
            iVar19 = (int)uVar22;
            if (uVar20 == uVar25) {
              dVar32 = (dVar32 + dVar32) * 0.5;
            }
            else {
              dVar30 = pRVar6[iVar27 + uVar25];
              dVar31 = 0.0;
              if (uVar25 != uVar15) {
                dVar31 = (pRVar6[iVar27 + uVar15] - dVar30) /
                         (pdVar5[(int)uVar15] - pdVar5[(int)uVar25]);
              }
              dVar33 = -1.0 - pdVar5[(int)uVar25];
              dVar32 = (dVar31 * dVar33 + dVar30 + dVar30) * dVar33 * 0.5 +
                       (pRVar6[iVar27 + uVar24] + dVar32) * (dVar29 + 1.0) * 0.5;
              lVar18 = (long)(int)uVar24;
              if ((int)uVar24 < (int)uVar25) {
                do {
                  lVar9 = lVar18 + 1;
                  pdVar1 = pdVar5 + lVar18;
                  lVar18 = lVar18 + 1;
                  pdVar2 = pRVar6 + uVar22;
                  uVar22 = (ulong)((int)uVar22 + 1);
                  dVar32 = dVar32 + (*pdVar2 + pRVar6[uVar22]) * (pdVar5[lVar9] - *pdVar1) * 0.5;
                } while ((int)uVar25 != lVar18);
              }
              dVar32 = dVar32 / 0.0;
            }
            *(double *)(local_298 + (long)(int)uVar26 * 8) = dVar32;
            uVar26 = uVar26 + 1;
            uVar22 = (ulong)(iVar19 + uVar4);
          } while (uVar26 != uVar16);
        }
      }
      pdVar14[0xe] = (double)local_298._0_8_;
      dVar7 = 1.0 / (adStack_280[7] * 34.014 +
                     adStack_280[6] * 33.006 +
                     adStack_280[5] * 17.007 +
                     adStack_280[4] * 15.999 +
                     adStack_280[3] * 1.008 +
                     adStack_280[2] * 18.015 +
                     adStack_280[1] * 31.998 + adStack_280[0] * 2.016 + 0.0 +
                    adStack_280[8] * 28.014);
      local_108[0] = adStack_280[0] * 2.016 * dVar7;
      local_108[1] = adStack_280[1] * 31.998 * dVar7;
      local_108[2] = adStack_280[2] * 18.015 * dVar7;
      local_108[3] = adStack_280[3] * 1.008 * dVar7;
      local_108[4] = adStack_280[4] * 15.999 * dVar7;
      local_108[5] = adStack_280[5] * 17.007 * dVar7;
      local_108[6] = adStack_280[6] * 33.006 * dVar7;
      local_108[7] = adStack_280[7] * 34.014 * dVar7;
      local_108[8] = adStack_280[8] * 28.014 * dVar7;
      dVar7 = local_330->P_mean;
      local_388[0] = 0.49603174603174605;
      local_388[1] = 0.03125195324707794;
      local_388[2] = 0.055509297807382736;
      local_388[3] = 0.9920634920634921;
      local_368._8_8_ = 0x3fae1af1b70e12fe;
      local_368._0_8_ = 0x3fb000418a43bf8c;
      local_358 = 0.030297521662727988;
      dStack_350 = 0.029399658963956014;
      local_348 = &DAT_3fa246cdaf410bdd;
      lVar18 = 0;
      do {
        local_b8[lVar18] = local_108[lVar18] * local_388[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 9);
      dVar29 = 0.0;
      lVar18 = 0;
      do {
        dVar29 = dVar29 + local_b8[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 9);
      dVar7 = ((dVar7 * 10.0) / (dVar29 * (double)local_298._0_8_ * 83144626.1815324)) * 1000.0;
      pdVar14[3] = dVar7;
      dVar31 = (double)local_298._0_8_ * (double)local_298._0_8_;
      dVar30 = (double)local_298._0_8_ * dVar31;
      dVar32 = (double)local_298._0_8_ * dVar30;
      local_b8[0] = 0.49603174603174605;
      local_b8[1] = 0.03125195324707794;
      local_b8[2] = 0.055509297807382736;
      uStack_a0 = 0xfbefbefbf0;
      uStack_9b = 0x3fefbe;
      uStack_98 = 0x418a43bf8c;
      uStack_93 = 0x3fb000;
      uStack_90 = 0x3fae1af1b70e12fe;
      local_88 = 0x3f9f065042c3dbd3;
      uStack_80 = 0x3f9e1af1b70e12fe;
      local_78 = &DAT_3fa246cdaf410bdd;
      dVar29 = 1.0 / (double)local_298._0_8_;
      local_388[3] = dVar29 * 25471.627 +
                     dVar32 * 0.0 +
                     dVar30 * 0.0 + dVar31 * 0.0 + (double)local_298._0_8_ * 0.0 + 2.5;
      if (1000.0 <= (double)local_298._0_8_) {
        local_388[0] = dVar29 * -835.033997 +
                       dVar32 * 3.16550358e-16 +
                       dVar30 * -2.30789455e-12 +
                       dVar31 * -1.8779429e-08 +
                       (double)local_298._0_8_ * 0.000350032206 + 2.99142337;
        local_388[1] = dVar29 * -1233.93018 +
                       dVar32 * -2.27287062e-16 +
                       dVar30 * 4.4382037e-12 +
                       dVar31 * -4.19613997e-08 +
                       (double)local_298._0_8_ * 0.000306759845 + 3.69757819;
        local_388[2] = dVar29 * -29899.209 +
                       dVar32 * -1.27832357e-15 +
                       dVar30 * 3.00249098e-11 +
                       dVar31 * -2.9100867e-07 +
                       (double)local_298._0_8_ * 0.00152814644 + 2.67214561;
        dVar33 = dVar29 * 3683.62875 +
                 dVar32 * -2.66391752e-16 +
                 dVar30 * 7.63046685e-12 +
                 dVar31 * -8.63609193e-08 + (double)local_298._0_8_ * 0.00052825224 + 2.86472886;
        local_368._8_4_ = SUB84(dVar33,0);
        local_368._0_8_ =
             dVar29 * 29230.8027 +
             dVar32 * -8.736103e-17 +
             dVar30 * 1.13776685e-12 +
             dVar31 * -1.03426778e-09 + (double)local_298._0_8_ * -1.37753096e-05 + 2.54205966;
        local_368._12_4_ = (int)((ulong)dVar33 >> 0x20);
        local_358 = dVar29 * 111.856713 +
                    dVar32 * -2.1581707e-15 +
                    dVar30 * 2.85615925e-11 +
                    dVar31 * -2.11219383e-07 + (double)local_298._0_8_ * 0.00111991006 + 4.0172109;
        dStack_350 = dVar29 * -18006.9609 +
                     dVar32 * -2.86330712e-15 +
                     dVar30 * 5.87225893e-11 +
                     dVar31 * -4.9156294e-07 + (double)local_298._0_8_ * 0.0021680682 + 4.57316685;
        dVar32 = dVar32 * -1.3506702e-15 +
                 dVar30 * 2.52426e-11 +
                 dVar31 * -1.89492033e-07 + (double)local_298._0_8_ * 0.0007439885 + 2.92664;
        dVar29 = dVar29 * -922.7977;
      }
      else {
        local_388[0] = dVar29 * -1012.52087 +
                       dVar32 * 8.26974448e-14 +
                       dVar30 * -2.36885858e-11 +
                       dVar31 * -2.71433843e-07 +
                       (double)local_298._0_8_ * 0.000412472087 + 3.29812431;
        local_388[1] = dVar29 * -1005.24902 +
                       dVar32 * -1.75371078e-13 +
                       dVar30 * 3.28469308e-10 +
                       dVar31 * -1.91871682e-07 +
                       (double)local_298._0_8_ * 0.000563743175 + 3.2129364;
        local_388[2] = dVar29 * -30208.1133 +
                       dVar32 * -5.01317694e-13 +
                       dVar30 * 1.74214532e-09 +
                       dVar31 * -2.11823211e-06 +
                       (double)local_298._0_8_ * 0.00173749123 + 3.38684249;
        dVar33 = dVar29 * 3346.30913 +
                 dVar32 * 4.12474758e-13 +
                 dVar30 * -1.44963411e-09 +
                 dVar31 * 2.1758823e-06 + (double)local_298._0_8_ * -0.0016127247 + 4.12530561;
        local_368._8_4_ = SUB84(dVar33,0);
        local_368._0_8_ =
             dVar29 * 29147.6445 +
             dVar32 * 7.78139272e-14 +
             dVar30 * -4.00710797e-10 +
             dVar31 * 8.07010567e-07 + (double)local_298._0_8_ * -0.000819083245 + 2.94642878;
        local_368._12_4_ = (int)((ulong)dVar33 >> 0x20);
        local_358 = dVar29 * 294.80804 +
                    dVar32 * 1.85845025e-12 +
                    dVar30 * -6.06909735e-09 +
                    dVar31 * 7.05276303e-06 + (double)local_298._0_8_ * -0.00237456025 + 4.30179801;
        dStack_350 = dVar29 * -17663.1465 +
                     dVar32 * 4.9430295e-13 +
                     dVar30 * -1.15645138e-09 +
                     dVar31 * -4.95004193e-08 + (double)local_298._0_8_ * 0.0032846129 + 3.38875365;
        dVar32 = dVar32 * -4.88971e-13 +
                 dVar30 * 1.41037875e-09 +
                 dVar31 * -1.321074e-06 + (double)local_298._0_8_ * 0.00070412 + 3.298677;
        dVar29 = dVar29 * -1020.9;
      }
      local_348 = (undefined1 *)(dVar29 + dVar32);
      lVar18 = 0;
      do {
        local_388[lVar18] =
             local_b8[lVar18] * (double)local_298._0_8_ * 83144626.1815324 * local_388[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 9);
      pdVar14[0xd] = 0.0;
      dVar29 = 0.0;
      lVar18 = 0;
      do {
        dVar29 = dVar29 + local_108[lVar18] * local_388[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 9);
      pdVar14[0xd] = dVar29;
      pdVar14[0xd] = dVar7 * 0.0001 * dVar29;
      lVar18 = 4;
      do {
        pdVar14[lVar18] = local_108[lVar18 + -4] * pdVar14[3];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xd);
      uStack_98 = (undefined5)((ulong)*(undefined8 *)((long)pdVar14 + 0x1d) >> 0x18);
      local_b8[2] = pdVar14[2];
      uStack_a0 = SUB85(pdVar14[3],0);
      uStack_9b = (undefined3)((ulong)pdVar14[3] >> 0x28);
      local_b8[0] = *pdVar14;
      local_b8[1] = pdVar14[1];
      if (ctrl_use_temp == false) {
        if (fuelName_abi_cxx11_._M_string_length == 0) {
          amrex::Abort_host("Using activeControl based on fuel mass requires ns.fuelName !");
        }
        local_298._0_8_ = (pointer)0x0;
        local_298._8_8_ = (pointer)0x0;
        local_298._16_8_ = 0;
        pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                  ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_298);
        uVar17 = 0xffffffff;
        lVar18 = 0;
        uVar28 = 0;
        do {
          iVar27 = std::__cxx11::string::compare((string *)(local_298._0_8_ + lVar18));
          if (iVar27 == 0) {
            uVar17 = uVar28 & 0xffffffff;
          }
          uVar28 = uVar28 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar28 != 9);
        ctrl_scale = local_340 * local_b8[(long)(int)uVar17 + (long)first_spec];
        ctrl_cfix = ctrl_scale * ctrl_h;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
      }
      else {
        ctrl_scale = 1.0;
        ctrl_cfix = ctrl_h;
      }
      pAVar11 = ac_parm;
      ctrl_V_in = local_b8[ctrl_flameDir];
      ctrl_V_in_old = ctrl_V_in;
      ac_parm->ctrl_V_in = ctrl_V_in;
      pAVar12 = ac_parm_d;
      uVar4 = pAVar11->ctrl_active;
      uVar10 = *(undefined4 *)&pAVar11->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar11->ctrl_tBase;
      pAVar12->ctrl_active = uVar4;
      *(undefined4 *)&pAVar12->field_0x1c = uVar10;
      RVar8 = pAVar11->ctrl_V_in;
      pAVar12->ctrl_dV = pAVar11->ctrl_dV;
      pAVar12->ctrl_V_in = RVar8;
      if ((ctrl_verbose != 0) && (ctrl_active == true)) {
        if (ctrl_use_temp == true) {
          local_298._8_8_ = amrex::OutStream();
          poVar3 = (ostringstream *)(local_298 + 0x10);
          local_298._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
          local_298._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
               *(undefined8 *)
                ((long)(local_298._8_8_ + 8) +
                *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," Active control based on temperature iso-level activated.",
                     0x39);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," Maintaining the flame at ",0x1a);
          std::ostream::_M_insert<double>(ctrl_h);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," in ",4);
          std::ostream::operator<<(poVar3,ctrl_flameDir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," direction. \n",0xd)
          ;
        }
        else {
          local_298._8_8_ = amrex::OutStream();
          poVar3 = (ostringstream *)(local_298 + 0x10);
          local_298._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
          local_298._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          *(undefined8 *)((long)adStack_280 + *(long *)(local_298._16_8_ - 0x18)) =
               *(undefined8 *)
                ((long)(local_298._8_8_ + 8) +
                *(long *)(((_Alloc_hider *)local_298._8_8_)->_M_p + -0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," Active control based on fuel mass activated.",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," Maintaining the flame at ",0x1a);
          std::ostream::_M_insert<double>(ctrl_h);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," in ",4);
          std::ostream::operator<<(poVar3,ctrl_flameDir);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," direction. \n",0xd)
          ;
        }
        amrex::Print::~Print((Print *)local_298);
      }
      if (local_308.m_data != (double *)0x0) {
        operator_delete(local_308.m_data,local_308.m_capacity << 3);
      }
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2f0);
  }
  return;
}

Assistant:

void
PeleLM::initActiveControl()
{
   if (level!=0) return;

   if (verbose > 1) Print() <<  "PeleLM::initActiveControl()\n";

   // Parse input file
   ParmParse ppAC("active_control");
   ppAC.query("on",ctrl_active);
   ppAC.query("use_temp",ctrl_use_temp);
   ppAC.query("temperature",ctrl_temperature);
   ppAC.query("tau",ctrl_tauControl);
   ppAC.query("v",ctrl_verbose);
   ppAC.query("height",ctrl_h);
   ppAC.query("changeMax",ctrl_changeMax);
   ppAC.query("velMax",ctrl_velMax);
   ppAC.query("pseudo_gravity",ctrl_pseudoGravity);
   ppAC.query("flame_direction",ctrl_flameDir);
   ppAC.query("AC_history",ctrl_AChistory);
   ppAC.query("npoints_average",ctrl_NavgPts);
   ppAC.query("method",ctrl_method);

   // Active control checks
   if ( ctrl_use_temp && (ctrl_temperature <= 0.0) )
      amrex::Error("active_control.temperature MUST be set with active_control.use_temp = 1");

   if ( ctrl_active && (ctrl_tauControl <= 0.0) )
      amrex::Error("active_control.tau MUST be set when using active_control");

   if ( ctrl_active && (ctrl_h <= 0.0) )
      amrex::Error("active_control.height MUST be set when using active_control");

   if ( ctrl_active && ( ctrl_flameDir > 2 ) )
      amrex::Error("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");

   // Exit here if AC not activated
   if ( !ctrl_active ) {
      ac_parm->ctrl_active = ctrl_active;
      amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);
      return;
   }

   // Activate AC in problem specific / GPU compliant sections
   ac_parm->ctrl_active = ctrl_active;

   // Resize vector for temporal average
   ctrl_time_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_velo_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_cntl_pts.resize(ctrl_NavgPts+1,-1.0);

   // Compute some active control parameters
   Real area_tot = 1.0;
   const Real* problo = geom.ProbLo();
   const Real* probhi = geom.ProbHi();
   for (int dim = 0; dim < AMREX_SPACEDIM; dim++) {
      if (dim != ctrl_flameDir) area_tot *= (probhi[dim] - problo[dim]);
   }

   // Extract data from bc: assumes flow comes in from lo side of ctrl_flameDir
   ProbParm const* lprobparm = prob_parm_d;
   ACParm const* lacparm = ac_parm_d;
   pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();
   amrex::Gpu::DeviceVector<amrex::Real> s_ext_v(DEF_NUM_STATE);
   amrex::Real* s_ext_d = s_ext_v.data();
   amrex::Real x[AMREX_SPACEDIM] = {AMREX_D_DECL(problo[0],problo[1],problo[2])};
   x[ctrl_flameDir] -= 1.0;
   const int ctrl_flameDir_l = ctrl_flameDir;
   const amrex::Real time_l = -1.0;
   const auto geomdata = geom.data();
   Box dumbx({AMREX_D_DECL(0,0,0)},{AMREX_D_DECL(0,0,0)});
   amrex::ParallelFor(dumbx, [x,s_ext_d,ctrl_flameDir_l,time_l,geomdata,lprobparm,lacparm, lpmfdata]
   AMREX_GPU_DEVICE(int /*i*/, int /*j*/, int /*k*/) noexcept
   {
      bcnormal(x, s_ext_d, ctrl_flameDir_l, 1, time_l, geomdata, *lprobparm, *lacparm, lpmfdata);
   });
   amrex::Real s_ext[DEF_NUM_STATE];
#ifdef AMREX_USE_GPU
   amrex::Gpu::dtoh_memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#else
   std::memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#endif

   if ( !ctrl_use_temp ) {
      // Get the fuel rhoY
      if (fuelName.empty()) {
          Abort("Using activeControl based on fuel mass requires ns.fuelName !");
      }
      Vector<std::string> specNames;
      pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
      int fuelidx = -1;
      for (int k = 0; k < NUM_SPECIES; k++) {
         if ( !specNames[k].compare(fuelName) ) fuelidx = k;
      }
      ctrl_scale = area_tot * s_ext[first_spec+fuelidx];
      ctrl_cfix  = ctrl_h * ctrl_scale;
   } else {
      // If using temp, scale is 1.0
      ctrl_scale = 1.0;
      ctrl_cfix = ctrl_h;
   }

   // Extract initial ctrl_V_in from bc
   ctrl_V_in  = s_ext[ctrl_flameDir];
   ctrl_V_in_old = ctrl_V_in;

   // Pass V_in to bc
   ac_parm->ctrl_V_in = ctrl_V_in;
   amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);

   if ( ctrl_verbose && ctrl_active ) {
      if ( ctrl_use_temp ) {
         Print() << " Active control based on temperature iso-level activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      } else {
         Print() << " Active control based on fuel mass activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      }
   }
}